

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_io.c
# Opt level: O2

uintmax_t duckdb_je_malloc_strtoumax(char *nptr,char **endptr,int base)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  int *piVar5;
  uintmax_t uVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  byte bVar10;
  ulong uVar11;
  byte *pbVar12;
  bool bVar13;
  
  iVar8 = 0x16;
  pbVar3 = (byte *)nptr;
  pbVar12 = (byte *)nptr;
  if ((uint)base < 0x25 && base != 1) {
    for (pbVar12 = (byte *)(nptr + 1); (bVar10 = pbVar12[-1], bVar10 - 9 < 5 || (bVar10 == 0x20));
        pbVar12 = pbVar12 + 1) {
    }
    if (bVar10 == 0x2b) {
      bVar2 = false;
LAB_01e92afb:
      bVar10 = *pbVar12;
    }
    else {
      if (bVar10 == 0x2d) {
        bVar2 = true;
        goto LAB_01e92afb;
      }
      pbVar12 = pbVar12 + -1;
      bVar2 = false;
    }
    pbVar9 = pbVar12;
    if (bVar10 == 0x30) {
      pbVar9 = pbVar12 + 1;
      bVar10 = pbVar12[1];
      if (bVar10 - 0x30 < 8) {
        if (base == 0) {
          base = 8;
        }
        bVar13 = base == 8;
      }
      else {
        if ((bVar10 != 0x58) && (bVar10 != 0x78)) {
          uVar6 = 0;
          goto LAB_01e92bfc;
        }
        pbVar9 = pbVar12;
        if ((0x36 < pbVar12[2] - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)(pbVar12[2] - 0x30) & 0x3f) & 1) == 0)) goto LAB_01e92b6a;
        if (base == 0) {
          base = 0x10;
        }
        pbVar9 = pbVar12 + 2;
        bVar13 = base == 0x10;
      }
      if (!bVar13) {
        pbVar9 = pbVar12;
      }
    }
LAB_01e92b6a:
    uVar4 = 10;
    if (base != 0) {
      uVar4 = (ulong)(uint)base;
    }
    uVar7 = 0;
    do {
      bVar1 = *pbVar9;
      bVar10 = bVar1 - 0x30;
      if (9 < bVar10) {
        if ((byte)(bVar1 + 0xbf) < 0x1a) {
          bVar10 = bVar1 - 0x37;
          goto joined_r0x01e92bb7;
        }
        if ((byte)(bVar1 + 0x9f) < 0x1a) {
          bVar10 = bVar1 + 0xa9;
          goto joined_r0x01e92bb7;
        }
LAB_01e92bd4:
        uVar6 = -uVar7;
        if (!bVar2) {
          uVar6 = uVar7;
        }
        pbVar3 = pbVar12;
        if (pbVar9 == pbVar12) break;
        goto LAB_01e92bfc;
      }
joined_r0x01e92bb7:
      if ((uint)uVar4 <= (uint)bVar10) goto LAB_01e92bd4;
      uVar11 = uVar7 * uVar4 + (ulong)bVar10;
      if (uVar11 < uVar7) goto LAB_01e92bea;
      pbVar9 = pbVar9 + 1;
      uVar7 = uVar11;
    } while( true );
  }
  goto LAB_01e92bef;
LAB_01e92bea:
  iVar8 = 0x22;
  pbVar3 = pbVar9;
LAB_01e92bef:
  pbVar9 = pbVar3;
  piVar5 = __errno_location();
  *piVar5 = iVar8;
  uVar6 = 0xffffffffffffffff;
LAB_01e92bfc:
  if (endptr != (char **)0x0) {
    if (pbVar9 != pbVar12) {
      nptr = (char *)pbVar9;
    }
    *endptr = nptr;
  }
  return uVar6;
}

Assistant:

uintmax_t
malloc_strtoumax(const char *restrict nptr, char **restrict endptr, int base) {
	uintmax_t ret, digit;
	unsigned b;
	bool neg;
	const char *p, *ns;

	p = nptr;
	if (base < 0 || base == 1 || base > 36) {
		ns = p;
		set_errno(EINVAL);
		ret = UINTMAX_MAX;
		goto label_return;
	}
	b = base;

	/* Swallow leading whitespace and get sign, if any. */
	neg = false;
	while (true) {
		switch (*p) {
		case '\t': case '\n': case '\v': case '\f': case '\r': case ' ':
			p++;
			break;
		case '-':
			neg = true;
			JEMALLOC_FALLTHROUGH;
		case '+':
			p++;
			JEMALLOC_FALLTHROUGH;
		default:
			goto label_prefix;
		}
	}

	/* Get prefix, if any. */
	label_prefix:
	/*
	 * Note where the first non-whitespace/sign character is so that it is
	 * possible to tell whether any digits are consumed (e.g., "  0" vs.
	 * "  -x").
	 */
	ns = p;
	if (*p == '0') {
		switch (p[1]) {
		case '0': case '1': case '2': case '3': case '4': case '5':
		case '6': case '7':
			if (b == 0) {
				b = 8;
			}
			if (b == 8) {
				p++;
			}
			break;
		case 'X': case 'x':
			switch (p[2]) {
			case '0': case '1': case '2': case '3': case '4':
			case '5': case '6': case '7': case '8': case '9':
			case 'A': case 'B': case 'C': case 'D': case 'E':
			case 'F':
			case 'a': case 'b': case 'c': case 'd': case 'e':
			case 'f':
				if (b == 0) {
					b = 16;
				}
				if (b == 16) {
					p += 2;
				}
				break;
			default:
				break;
			}
			break;
		default:
			p++;
			ret = 0;
			goto label_return;
		}
	}
	if (b == 0) {
		b = 10;
	}

	/* Convert. */
	ret = 0;
	while ((*p >= '0' && *p <= '9' && (digit = *p - '0') < b)
	    || (*p >= 'A' && *p <= 'Z' && (digit = 10 + *p - 'A') < b)
	    || (*p >= 'a' && *p <= 'z' && (digit = 10 + *p - 'a') < b)) {
		uintmax_t pret = ret;
		ret *= b;
		ret += digit;
		if (ret < pret) {
			/* Overflow. */
			set_errno(ERANGE);
			ret = UINTMAX_MAX;
			goto label_return;
		}
		p++;
	}
	if (neg) {
		ret = (uintmax_t)(-((intmax_t)ret));
	}

	if (p == ns) {
		/* No conversion performed. */
		set_errno(EINVAL);
		ret = UINTMAX_MAX;
		goto label_return;
	}

label_return:
	if (endptr != NULL) {
		if (p == ns) {
			/* No characters were converted. */
			*endptr = (char *)nptr;
		} else {
			*endptr = (char *)p;
		}
	}
	return ret;
}